

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O2

int mbedtls_ssl_cookie_setup
              (mbedtls_ssl_cookie_ctx *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  mbedtls_md_info_t *md_info;
  uchar *n;
  uchar key [32];
  
  n = key;
  iVar1 = (*f_rng)(p_rng,key,0x20);
  if (iVar1 == 0) {
    md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA224);
    iVar1 = mbedtls_md_setup(&ctx->hmac_ctx,md_info,1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_md_hmac_starts(&ctx->hmac_ctx,key,0x20);
      if (iVar1 == 0) {
        mbedtls_zeroize(key,(size_t)n);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_cookie_setup( mbedtls_ssl_cookie_ctx *ctx,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    int ret;
    unsigned char key[COOKIE_MD_OUTLEN];

    if( ( ret = f_rng( p_rng, key, sizeof( key ) ) ) != 0 )
        return( ret );

    ret = mbedtls_md_setup( &ctx->hmac_ctx, mbedtls_md_info_from_type( COOKIE_MD ), 1 );
    if( ret != 0 )
        return( ret );

    ret = mbedtls_md_hmac_starts( &ctx->hmac_ctx, key, sizeof( key ) );
    if( ret != 0 )
        return( ret );

    mbedtls_zeroize( key, sizeof( key ) );

    return( 0 );
}